

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::genRfaceids
               (FaceInfo *faces,int nfaces,uint32_t *rfaceids,uint32_t *faceids)

{
  CompareRfaceIds in_RCX;
  long in_RDX;
  int in_ESI;
  FaceInfo *in_RDI;
  int i_1;
  int i;
  int local_34;
  CompareRfaceIds in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    (in_RCX.faces)->adjfaces[(long)iVar1 + -1] = iVar1;
  }
  anon_unknown_1::CompareRfaceIds::CompareRfaceIds
            ((CompareRfaceIds *)&stack0xffffffffffffffd0,in_RDI);
  std::stable_sort<unsigned_int*,Ptex::v2_4::PtexUtils::(anonymous_namespace)::CompareRfaceIds>
            ((uint *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
             (uint *)in_stack_ffffffffffffffd0.faces,in_RCX);
  for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
    *(int *)(in_RDX + (ulong)(uint)(in_RCX.faces)->adjfaces[(long)local_34 + -1] * 4) = local_34;
  }
  return;
}

Assistant:

void genRfaceids(const FaceInfo* faces, int nfaces,
                 uint32_t* rfaceids, uint32_t* faceids)
{
    // stable_sort faceids by smaller dimension (u or v) in descending order
    // treat const faces as having res of 1

    // init faceids
    for (int i = 0; i < nfaces; i++) faceids[i] = i;

    // sort faceids by rfaceid
    std::stable_sort(faceids, faceids + nfaces, CompareRfaceIds(faces));

    // generate mapping from faceid to rfaceid
    for (int i = 0; i < nfaces; i++) {
        // note: i is the rfaceid
        rfaceids[faceids[i]] = i;
    }
}